

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O0

void __thiscall pg::NPPSolver::NPPSolver(NPPSolver *this,Oink *oink,Game *game)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  size_t sVar4;
  uintqueue *puVar5;
  ulong uVar6;
  uint *puVar7;
  uint local_f4;
  uint resprio;
  Game *game_local;
  Oink *oink_local;
  NPPSolver *this_local;
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__NPPSolver_002c75c8;
  this->totqueries = 0;
  this->totpromos = 0;
  this->maxqueries = 0;
  this->maxpromos = 0;
  this->queries = 0;
  this->promos = 0;
  this->doms = 0;
  lVar2 = Solver::nodecount(&this->super_Solver);
  uVar1 = Solver::priority(&this->super_Solver,(int)lVar2 + -1);
  this->maxprio = uVar1;
  piVar3 = Game::getStrategy(game);
  this->strategy = piVar3;
  piVar3 = (int *)operator_new__((ulong)(this->maxprio + 1) << 2);
  this->inverse = piVar3;
  bitset::bitset(&this->outgame);
  bitset::bitset(&this->winzero);
  this->Top = 0;
  this->End = 0;
  this->Pivot = 0;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->Phase);
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::vector(&this->Supgame);
  std::
  vector<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::vector(&this->Heads);
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::vector(&this->Exits);
  std::
  vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
  ::vector(&this->Entries);
  bitset::bitset(&this->R);
  bitset::bitset(&this->D);
  bitset::bitset(&this->O);
  uintqueue::uintqueue(&this->T);
  uintqueue::uintqueue(&this->E);
  local_f4 = this->maxprio / 0x14;
  if (local_f4 < 500) {
    local_f4 = 500;
  }
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->outgame,sVar4);
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->winzero,sVar4);
  std::vector<bool,_std::allocator<bool>_>::reserve(&this->Phase,(ulong)local_f4);
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::reserve(&this->Supgame,(ulong)local_f4);
  std::
  vector<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::reserve(&this->Heads,(ulong)local_f4);
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::reserve(&this->Exits,(ulong)local_f4);
  std::
  vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
  ::reserve(&this->Entries,(ulong)local_f4);
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->R,sVar4);
  puVar5 = &this->T;
  uVar6 = Solver::nodecount(&this->super_Solver);
  (this->T).pointer = 0;
  if ((puVar5->queue != (uint *)0x0) && (puVar5->queue != (uint *)0x0)) {
    operator_delete__(puVar5->queue);
  }
  puVar7 = (uint *)operator_new__((uVar6 & 0xffffffff) << 2);
  puVar5->queue = puVar7;
  puVar5 = &this->E;
  uVar6 = Solver::nodecount(&this->super_Solver);
  (this->E).pointer = 0;
  if ((puVar5->queue != (uint *)0x0) && (puVar5->queue != (uint *)0x0)) {
    operator_delete__(puVar5->queue);
  }
  puVar7 = (uint *)operator_new__((uVar6 & 0xffffffff) << 2);
  puVar5->queue = puVar7;
  return;
}

Assistant:

NPPSolver::NPPSolver(Oink& oink, Game& game) :
    Solver(oink, game),
    totqueries(0), totpromos(0), maxqueries(0), maxpromos(0), queries(0), promos(0), doms(0),
    maxprio(priority(nodecount() - 1)), strategy(game.getStrategy()), inverse(new int[maxprio + 1]),
    Top(0), End(0), Pivot(0)
{
    // TODO: rewrite to no longer copy the current game.strategy
    uint resprio = maxprio / 20;
    resprio = (resprio >= 500) ? resprio : 500;
    outgame.resize(nodecount());
    winzero.resize(nodecount());
    Phase.reserve(resprio);
    Supgame.reserve(resprio);
    Heads.reserve(resprio);
    Exits.reserve(resprio);
    Entries.reserve(resprio);
    R.resize(nodecount());
    T.resize(nodecount());
    E.resize(nodecount());
}